

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

sunrealtype N_VWSqrSumLocal_Serial(N_Vector x,N_Vector w)

{
  double dVar1;
  sunrealtype *wd;
  sunrealtype *xd;
  sunrealtype prodi;
  sunrealtype sum;
  sunindextype N;
  sunindextype i;
  N_Vector w_local;
  N_Vector x_local;
  
  sum = 0.0;
  for (i = 0; i < *x->content; i = i + 1) {
    dVar1 = *(double *)(*(long *)((long)x->content + 0x10) + i * 8) *
            *(double *)(*(long *)((long)w->content + 0x10) + i * 8);
    sum = dVar1 * dVar1 + sum;
  }
  return sum;
}

Assistant:

sunrealtype N_VWSqrSumLocal_Serial(N_Vector x, N_Vector w)
{
  sunindextype i, N;
  sunrealtype sum, prodi, *xd, *wd;

  sum = ZERO;
  xd = wd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  wd = NV_DATA_S(w);

  for (i = 0; i < N; i++)
  {
    prodi = xd[i] * wd[i];
    sum += SUNSQR(prodi);
  }

  return (sum);
}